

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoleFilter.cpp
# Opt level: O1

ComplexPair * __thiscall
Iir::BandPassTransform::transform
          (ComplexPair *__return_storage_ptr__,BandPassTransform *this,complex_t c)

{
  double in_XMM0_Qa;
  undefined8 uVar1;
  undefined8 uVar2;
  double in_XMM1_Qa;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double local_48;
  double dStack_40;
  double local_38;
  double dStack_30;
  
  if (((in_XMM0_Qa < INFINITY) || (in_XMM1_Qa != 0.0)) || (NAN(in_XMM1_Qa))) {
    local_48 = (double)__divdc3(in_XMM0_Qa + 1.0,in_XMM1_Qa,1.0 - in_XMM0_Qa,-in_XMM1_Qa,
                                __return_storage_ptr__,this,c._M_value._0_8_,c._M_value._8_8_);
    dVar4 = (this->a2 + -1.0) * this->b2;
    dVar5 = (dVar4 + 1.0) * 4.0;
    dStack_30 = in_XMM1_Qa * dVar5 + 0.0;
    local_38 = (dVar4 + -1.0) * 8.0 + local_48 * dVar5 + 0.0;
    dStack_40 = in_XMM1_Qa;
    std::complex<double>::operator*=((complex<double> *)&local_38,(complex<double> *)&local_48);
    local_38 = ((this->a2 + -1.0) * this->b2 + 1.0) * 4.0 + local_38;
    dVar5 = csqrt(local_38);
    dVar4 = this->ab_2;
    local_38 = dVar4 * local_48 + dVar5 + dVar4;
    dVar8 = dVar4 * dStack_40 - dStack_30;
    dVar6 = this->b + -1.0;
    dVar6 = dVar6 + dVar6;
    dVar7 = dVar6 * dStack_40 + 0.0;
    dVar3 = this->b + 1.0;
    dVar3 = dVar3 + dVar3 + local_48 * dVar6 + 0.0;
    dStack_30 = dVar4 * dStack_40 + dStack_30;
    uVar1 = __divdc3((dVar4 * local_48 - dVar5) + dVar4,dVar8,dVar3,dVar7);
    uVar2 = __divdc3(local_38,dStack_30,dVar3,dVar7);
    *(undefined8 *)(__return_storage_ptr__->super_complex_pair_t).first._M_value = uVar1;
    *(double *)((__return_storage_ptr__->super_complex_pair_t).first._M_value + 8) = dVar8;
    *(undefined8 *)(__return_storage_ptr__->super_complex_pair_t).second._M_value = uVar2;
    *(double *)((__return_storage_ptr__->super_complex_pair_t).second._M_value + 8) = dStack_30;
  }
  else {
    *(undefined8 *)(__return_storage_ptr__->super_complex_pair_t).first._M_value =
         0xbff0000000000000;
    *(undefined8 *)((__return_storage_ptr__->super_complex_pair_t).first._M_value + 8) = 0;
    *(undefined8 *)(__return_storage_ptr__->super_complex_pair_t).second._M_value =
         0x3ff0000000000000;
    *(undefined8 *)((__return_storage_ptr__->super_complex_pair_t).second._M_value + 8) = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

ComplexPair BandPassTransform::transform (complex_t c)
{
	if (c == infinity())
		return ComplexPair (-1, 1);
	
	c = (1. + c) / (1. - c); // bilinear
	
	complex_t v = 0;
	v = addmul (v, 4 * (b2 * (a2 - 1) + 1), c);
	v += 8 * (b2 * (a2 - 1) - 1);
	v *= c;
	v += 4 * (b2 * (a2 - 1) + 1);
	v = std::sqrt (v);
	
	complex_t u = -v;
	u = addmul (u, ab_2, c);
	u += ab_2;
	
	v = addmul (v, ab_2, c);
	v += ab_2;
	
	complex_t d = 0;
	d = addmul (d, 2 * (b - 1), c) + 2 * (1 + b);
	
	return ComplexPair (u/d, v/d);
}